

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::extractClassName_abi_cxx11_(StringRef *classOrQualifiedMethodName)

{
  bool bVar1;
  string *in_RDI;
  size_t penultimateColons;
  size_t lastColons;
  string *className;
  undefined8 in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string local_58 [32];
  StringRef *in_stack_ffffffffffffffc8;
  
  StringRef::operator_cast_to_string(in_stack_ffffffffffffffc8);
  bVar1 = startsWith(in_stack_ffffffffffffff90,(char)((ulong)in_stack_ffffffffffffff88 >> 0x38));
  if (bVar1) {
    std::__cxx11::string::rfind((char *)in_RDI,0x1ef92a);
    std::__cxx11::string::rfind((char *)in_RDI,0x1ef92a);
    std::__cxx11::string::substr((ulong)local_58,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

std::string extractClassName( StringRef const& classOrQualifiedMethodName ) {
        std::string className(classOrQualifiedMethodName);
        if( startsWith( className, '&' ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }